

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manual-optimizer.cpp
# Opt level: O3

result * baryonyx::itm::manual_optimize(result *__return_storage_ptr__,context *ctx,problem *pb)

{
  double dVar1;
  ulong uVar2;
  pointer *__ptr;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  args;
  manual_course local_2a8;
  double local_270;
  double best;
  undefined1 local_260 [16];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_250;
  double local_248;
  void *local_238;
  double local_228;
  void *local_220;
  double local_218;
  long local_210;
  void *local_208;
  long local_1f8;
  vector<baryonyx::solution,_std::allocator<baryonyx::solution>_> local_1f0 [2];
  int local_1b8;
  context internal;
  
  notice<>(ctx,"- auto-tune parameters (manual) starts\n");
  manual_course::manual_course
            (&local_2a8,(ctx->parameters).theta,(ctx->parameters).delta,(ctx->parameters).kappa_min,
             (ctx->parameters).kappa_step,(ctx->parameters).init_policy_random,5);
  context::context(&internal,ctx);
  best = INFINITY;
  internal.log_priority = warning;
  local_270 = INFINITY;
  while( true ) {
    internal.parameters.theta =
         *(double *)
          ((long)local_2a8.theta._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>.
                 _M_t.super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                 super__Head_base<0UL,_double_*,_false>._M_head_impl +
          (long)*(int *)local_2a8.iterators._M_t.
                        super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
                        super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                        super__Head_base<0UL,_int_*,_false>._M_head_impl * 8);
    internal.parameters.delta =
         *(double *)
          ((long)local_2a8.delta._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>.
                 _M_t.super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                 super__Head_base<0UL,_double_*,_false>._M_head_impl +
          (long)*(int *)((long)local_2a8.iterators._M_t.
                               super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
                               super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                               super__Head_base<0UL,_int_*,_false>._M_head_impl + 4) * 8);
    internal.parameters.kappa_min =
         *(double *)
          ((long)local_2a8.kappa_min._M_t.
                 super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                 super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                 super__Head_base<0UL,_double_*,_false>._M_head_impl +
          (long)*(int *)((long)local_2a8.iterators._M_t.
                               super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
                               super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                               super__Head_base<0UL,_int_*,_false>._M_head_impl + 8) * 8);
    internal.parameters.kappa_step =
         *(double *)
          ((long)local_2a8.kappa_step._M_t.
                 super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                 super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                 super__Head_base<0UL,_double_*,_false>._M_head_impl +
          (long)*(int *)((long)local_2a8.iterators._M_t.
                               super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
                               super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                               super__Head_base<0UL,_int_*,_false>._M_head_impl + 0xc) * 8);
    internal.parameters.init_policy_random =
         *(double *)
          ((long)local_2a8.init_policy_random._M_t.
                 super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                 super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                 super__Head_base<0UL,_double_*,_false>._M_head_impl +
          (long)*(int *)((long)local_2a8.iterators._M_t.
                               super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
                               super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                               super__Head_base<0UL,_int_*,_false>._M_head_impl + 0x10) * 8);
    if (4 < (int)internal.log_priority) {
      local_260._0_8_ =
           "  - optimization with theta:{} delta:{} kappa-min:{} kappa-step:{} init-policy-random: {}"
      ;
      args.field_1.args_ = in_R9.args_;
      args.desc_ = (unsigned_long_long)(local_260 + 8);
      local_260._8_8_ = internal.parameters.theta;
      local_248 = internal.parameters.delta;
      local_238 = (void *)internal.parameters.kappa_min;
      local_228 = internal.parameters.kappa_step;
      local_218 = internal.parameters.init_policy_random;
      ::fmt::v7::vprint<char_const*,char>
                (_stdout,(FILE *)(context::message_style + 100),(text_style *)local_260,
                 (char **)0xaaaaa,args);
    }
    optimize((result *)(local_260 + 8),&internal,pb);
    if (local_1b8 == 0) {
      notice<double>(&internal,"{:f}\n",
                     &local_1f0[0].
                      super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>.
                      _M_impl.super__Vector_impl_data._M_finish[-1].value);
      dVar1 = local_1f0[0].
              super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
              super__Vector_impl_data._M_finish[-1].value;
      if (dVar1 < local_270) {
        local_270 = dVar1;
        best = dVar1;
      }
    }
    else {
      notice<>(&internal,"no solution\n");
    }
    std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::~vector(local_1f0);
    if (local_208 != (void *)0x0) {
      operator_delete(local_208,local_1f8 - (long)local_208);
    }
    if (local_220 != (void *)0x0) {
      operator_delete(local_220,local_210 - (long)local_220);
    }
    if (local_238 != (void *)0x0) {
      operator_delete(local_238,(long)local_228 - (long)local_238);
    }
    if (local_250 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_250);
    }
    if ((long)local_2a8.length < 1) break;
    uVar2 = (long)local_2a8.length + 1;
    while (local_2a8.length <=
           *(int *)((long)local_2a8.iterators._M_t.
                          super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
                          super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                          super__Head_base<0UL,_int_*,_false>._M_head_impl + (uVar2 - 2) * 4) + 1) {
      *(int *)((long)local_2a8.iterators._M_t.
                     super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
                     super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                     super__Head_base<0UL,_int_*,_false>._M_head_impl + (uVar2 - 2) * 4) = 0;
      uVar2 = uVar2 - 1;
      if (uVar2 < 2) goto LAB_001336e4;
    }
    *(int *)((long)local_2a8.iterators._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>.
                   _M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                   super__Head_base<0UL,_int_*,_false>._M_head_impl + (uVar2 - 2) * 4) =
         *(int *)((long)local_2a8.iterators._M_t.
                        super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
                        super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                        super__Head_base<0UL,_int_*,_false>._M_head_impl + (uVar2 - 2) * 4) + 1;
  }
LAB_001336e4:
  notice<double,double,double,double,double,double>
            (&internal,
             "  - manual optimization found solution {:f}: with theta:{} delta:{} kappa-min:{} kappa-step:{} init-random:{}\n"
             ,&best,(double *)
                    ((long)local_2a8.theta._M_t.
                           super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                           super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                           super__Head_base<0UL,_double_*,_false>._M_head_impl +
                    (long)*(int *)local_2a8.iterators._M_t.
                                  super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
                                  super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                                  super__Head_base<0UL,_int_*,_false>._M_head_impl * 8),
             (double *)
             ((long)local_2a8.delta._M_t.
                    super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                    super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                    super__Head_base<0UL,_double_*,_false>._M_head_impl +
             (long)*(int *)((long)local_2a8.iterators._M_t.
                                  super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
                                  super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                                  super__Head_base<0UL,_int_*,_false>._M_head_impl + 4) * 8),
             (double *)
             ((long)local_2a8.kappa_min._M_t.
                    super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                    super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                    super__Head_base<0UL,_double_*,_false>._M_head_impl +
             (long)*(int *)((long)local_2a8.iterators._M_t.
                                  super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
                                  super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                                  super__Head_base<0UL,_int_*,_false>._M_head_impl + 8) * 8),
             (double *)
             ((long)local_2a8.kappa_step._M_t.
                    super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                    super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                    super__Head_base<0UL,_double_*,_false>._M_head_impl +
             (long)*(int *)((long)local_2a8.iterators._M_t.
                                  super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
                                  super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                                  super__Head_base<0UL,_int_*,_false>._M_head_impl + 0xc) * 8),
             (double *)
             ((long)local_2a8.init_policy_random._M_t.
                    super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                    super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                    super__Head_base<0UL,_double_*,_false>._M_head_impl +
             (long)*(int *)((long)local_2a8.iterators._M_t.
                                  super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
                                  super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                                  super__Head_base<0UL,_int_*,_false>._M_head_impl + 0x10) * 8));
  optimize(__return_storage_ptr__,&internal,pb);
  if (internal.finish.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*internal.finish.super__Function_base._M_manager)
              ((_Any_data *)&internal.finish,(_Any_data *)&internal.finish,__destroy_functor);
  }
  if (internal.update.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*internal.update.super__Function_base._M_manager)
              ((_Any_data *)&internal.update,(_Any_data *)&internal.update,__destroy_functor);
  }
  if (internal.start.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*internal.start.super__Function_base._M_manager)
              ((_Any_data *)&internal.start,(_Any_data *)&internal.start,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)internal.method._M_dataplus._M_p != &internal.method.field_2) {
    operator_delete(internal.method._M_dataplus._M_p,
                    internal.method.field_2._M_allocated_capacity + 1);
  }
  if (local_2a8.iterators._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
      super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.super__Head_base<0UL,_int_*,_false>
      ._M_head_impl != (__uniq_ptr_impl<int,_std::default_delete<int[]>_>)0x0) {
    operator_delete__((void *)local_2a8.iterators._M_t.
                              super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
                              super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                              super__Head_base<0UL,_int_*,_false>._M_head_impl);
  }
  local_2a8.iterators._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
  super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.super__Head_base<0UL,_int_*,_false>.
  _M_head_impl = (__uniq_ptr_data<int,_std::default_delete<int[]>,_true,_true>)
                 (__uniq_ptr_impl<int,_std::default_delete<int[]>_>)0x0;
  if ((tuple<double_*,_std::default_delete<double[]>_>)
      local_2a8.init_policy_random._M_t.
      super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
      super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
      super__Head_base<0UL,_double_*,_false>._M_head_impl != (_Head_base<0UL,_double_*,_false>)0x0)
  {
    operator_delete__((void *)local_2a8.init_policy_random._M_t.
                              super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                              super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                              super__Head_base<0UL,_double_*,_false>._M_head_impl);
  }
  local_2a8.init_policy_random._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>.
  _M_t.super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
  super__Head_base<0UL,_double_*,_false>._M_head_impl =
       (__uniq_ptr_data<double,_std::default_delete<double[]>,_true,_true>)
       (__uniq_ptr_impl<double,_std::default_delete<double[]>_>)0x0;
  if ((_Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>)
      local_2a8.kappa_step._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
      super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
      super__Head_base<0UL,_double_*,_false>._M_head_impl != (double *)0x0) {
    operator_delete__((void *)local_2a8.kappa_step._M_t.
                              super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                              super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                              super__Head_base<0UL,_double_*,_false>._M_head_impl);
  }
  local_2a8.kappa_step._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
  super__Head_base<0UL,_double_*,_false>._M_head_impl =
       (__uniq_ptr_data<double,_std::default_delete<double[]>,_true,_true>)
       (__uniq_ptr_impl<double,_std::default_delete<double[]>_>)0x0;
  if ((_Head_base<0UL,_double_*,_false>)
      local_2a8.kappa_min._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
      super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
      super__Head_base<0UL,_double_*,_false>._M_head_impl != (_Head_base<0UL,_double_*,_false>)0x0)
  {
    operator_delete__((void *)local_2a8.kappa_min._M_t.
                              super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                              super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                              super__Head_base<0UL,_double_*,_false>._M_head_impl);
  }
  local_2a8.kappa_min._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
  super__Head_base<0UL,_double_*,_false>._M_head_impl =
       (__uniq_ptr_data<double,_std::default_delete<double[]>,_true,_true>)
       (__uniq_ptr_impl<double,_std::default_delete<double[]>_>)0x0;
  if (local_2a8.delta._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
      super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
      super__Head_base<0UL,_double_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<double,_std::default_delete<double[]>_>)0x0) {
    operator_delete__((void *)local_2a8.delta._M_t.
                              super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                              super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                              super__Head_base<0UL,_double_*,_false>._M_head_impl);
  }
  local_2a8.delta._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
  super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
  super__Head_base<0UL,_double_*,_false>._M_head_impl =
       (__uniq_ptr_data<double,_std::default_delete<double[]>,_true,_true>)
       (__uniq_ptr_impl<double,_std::default_delete<double[]>_>)0x0;
  if (local_2a8.theta._M_t.super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
      super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
      super__Head_base<0UL,_double_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<double,_std::default_delete<double[]>_>)0x0) {
    operator_delete__((void *)local_2a8.theta._M_t.
                              super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
                              super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
                              super__Head_base<0UL,_double_*,_false>._M_head_impl);
  }
  return __return_storage_ptr__;
}

Assistant:

result
manual_optimize(const baryonyx::context& ctx, const baryonyx::problem& pb)
{
    baryonyx::notice(ctx, "- auto-tune parameters (manual) starts\n");
    return ::optimize(ctx, pb);
}